

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManCutMatch(Nf_Man_t *p,int iObj)

{
  undefined1 *puVar1;
  float *pfVar2;
  Nf_Cfg_t NVar3;
  int iVar4;
  Nf_Obj_t *pNVar5;
  Nf_Obj_t *pNVar6;
  Mio_Cell2_t *pMVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Nf_Obj_t *pNVar12;
  int *piVar13;
  int *pCutSet;
  uint *puVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  Nf_Mat_t (*paNVar18) [2];
  long lVar19;
  int iVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  undefined8 uVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int local_ac;
  
  pNVar5 = p->pNfObjs;
  pNVar12 = pNVar5 + iObj;
  fVar23 = Nf_ObjFlowRefs(p,iObj,0);
  fVar24 = Nf_ObjFlowRefs(p,iObj,1);
  piVar13 = Nf_ObjCutSet(p,iObj);
  iVar8 = 0;
  iVar9 = 0;
  if (p->Iter != 0) {
    pNVar6 = p->pNfObjs;
    pCutSet = Nf_ObjCutSet(p,iObj);
    for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
      iVar8 = Nf_ObjRequired(p,iObj,(int)lVar17);
      if (iVar8 == 0x3fffffff) {
        uVar11 = *(uint *)pNVar6[iObj].M[lVar17];
        uVar16 = uVar11 & 0xfffff;
        pMVar7 = p->pCells;
        puVar14 = (uint *)Nf_CutFromHandle(pCutSet,uVar11 >> 0x14 & 0x3ff);
        lVar19 = 0;
        iVar8 = 0;
        local_ac = 0;
        for (uVar21 = 0; uVar21 < (*puVar14 & 0x1f); uVar21 = uVar21 + 1) {
          NVar3 = pNVar6[iObj].M[lVar17][0].Cfg;
          uVar11 = puVar14[(ulong)(((uint)NVar3 >> 8) >> ((byte)lVar19 & 0x1f) & 0xf) + 1];
          if ((long)(int)uVar11 == 0) break;
          bVar22 = (((uint)NVar3 >> 1 & 0x7f) >> ((uint)uVar21 & 0x1f) & 1) != 0;
          iVar20 = *(int *)((long)pMVar7[uVar16].iDelays + lVar19) +
                   p->pNfObjs[(int)uVar11].M[bVar22][0].D;
          iVar9 = Nf_ObjRequired(p,uVar11,(uint)bVar22);
          if (iVar8 <= iVar20) {
            iVar8 = iVar20;
          }
          if ((iVar9 < 0x3fffffff) &&
             (iVar9 = iVar9 + *(int *)((long)pMVar7[uVar16].iDelays + lVar19), local_ac <= iVar9)) {
            local_ac = iVar9;
          }
          lVar19 = lVar19 + 4;
        }
        local_ac = p->InvDelayI * p->pPars->nReqTimeFlex + local_ac;
        if (local_ac <= iVar8) {
          local_ac = iVar8;
        }
        Nf_ObjSetRequired(p,iObj,(int)lVar17,local_ac);
      }
    }
    iVar8 = Nf_ObjRequired(p,iObj,0);
    iVar9 = Nf_ObjRequired(p,iObj,1);
  }
  paNVar18 = pNVar5[iObj].M + 1;
  *(undefined8 *)pNVar12->M[0] = 0;
  pNVar12->M[0][0].D = 0;
  pNVar12->M[0][0].F = 0.0;
  *(undefined8 *)pNVar12->M[1] = 0;
  pNVar12->M[1][0].D = 0;
  pNVar12->M[1][0].F = 0.0;
  *(undefined8 *)(pNVar12->M[1] + 1) = 0;
  *(undefined8 *)(pNVar12->M[0] + 1) = 0;
  pNVar12->M[0][1].D = 0;
  pNVar12->M[0][1].F = 0.0;
  pNVar12->M[0][0].D = 0x3fffffff;
  pNVar12->M[0][0].F = 3.4028235e+38;
  pNVar12->M[1][0].D = 0x3fffffff;
  pNVar12->M[1][0].F = 3.4028235e+38;
  pNVar12->M[0][1].D = 0x3fffffff;
  pNVar12->M[0][1].F = 3.4028235e+38;
  pNVar12->M[1][1].D = 0x3fffffff;
  pNVar12->M[1][1].F = 3.4028235e+38;
  puVar14 = (uint *)(piVar13 + 1);
  for (iVar20 = 0; iVar20 < *piVar13; iVar20 = iVar20 + 1) {
    iVar10 = Abc_Lit2Var(*puVar14 >> 5);
    if (iVar10 < p->vTt2Match->nSize) {
      uVar11 = *puVar14 & 0x1f;
      if ((uVar11 == 1) && (puVar14[1] == iObj)) {
        __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fa,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      if (p->pPars->nLutSize < (int)uVar11) {
        __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fb,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      iVar10 = Abc_Lit2Var(*puVar14 >> 5);
      if (p->vTt2Match->nSize <= iVar10) {
        __assert_fail("Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x4fc,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      Nf_ManCutMatchOne(p,iObj,(int *)puVar14,piVar13);
    }
    puVar14 = puVar14 + (ulong)(*puVar14 & 0x1f) + 1;
  }
  pNVar12->M[0][0].F = pNVar12->M[0][0].F / fVar23;
  pNVar12->M[1][0].F = pNVar12->M[1][0].F / fVar24;
  auVar26._4_4_ = pNVar12->M[0][1].F;
  auVar26._0_4_ = pNVar12->M[1][1].F;
  auVar26._8_8_ = 0;
  auVar27._4_4_ = fVar23;
  auVar27._0_4_ = fVar24;
  auVar27._8_4_ = extraout_XMM0_Db_00;
  auVar27._12_4_ = extraout_XMM0_Db;
  auVar27 = divps(auVar26,auVar27);
  uVar25 = auVar27._0_8_;
  pNVar12->M[0][1].F = auVar27._4_4_;
  pNVar12->M[1][1].F = auVar27._0_4_;
  iVar20 = pNVar12->M[0][0].D;
  iVar10 = pNVar12->M[1][0].D;
  if (0x3ffffffe < iVar10 && 0x3ffffffe < iVar20) {
    __assert_fail("pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x512,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (p->InvDelayI + iVar10 < iVar20) {
    NVar3 = ((Nf_Mat_t *)((long)paNVar18 + 0))->Cfg;
    iVar20 = pNVar5[iObj].M[1][0].D;
    fVar23 = pNVar5[iObj].M[1][0].F;
    *(undefined4 *)&pNVar12->M[0][0].field_0x0 =
         *(undefined4 *)&((Nf_Mat_t *)((long)paNVar18 + 0))->field_0x0;
    pNVar12->M[0][0].Cfg = NVar3;
    pNVar12->M[0][0].D = iVar20;
    pNVar12->M[0][0].F = fVar23;
    iVar20 = pNVar12->M[0][0].D + p->InvDelayI;
    pNVar12->M[0][0].D = iVar20;
    pNVar12->M[0][0].F = p->InvAreaF + pNVar12->M[0][0].F;
    puVar1 = &pNVar12->M[0][0].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    iVar15 = pNVar12->M[0][1].D;
    if (iVar15 == 0x3fffffff) {
      NVar3 = pNVar12->M[0][0].Cfg;
      *(undefined4 *)&pNVar5[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar12->M[0][0].field_0x0;
      pNVar5[iObj].M[0][1].Cfg = NVar3;
      pNVar5[iObj].M[0][1].D = pNVar12->M[0][0].D;
      pNVar5[iObj].M[0][1].F = pNVar12->M[0][0].F;
      goto LAB_00605c18;
    }
LAB_00605c34:
    fVar23 = (float)((ulong)uVar25 >> 0x20);
    iVar4 = pNVar12->M[1][1].D;
    if (((float)uVar25 + p->InvAreaF + 0.001 < fVar23) && (p->InvDelayI + iVar4 <= iVar8))
    goto LAB_00605cc8;
    if ((iVar4 == 0x3fffffff) ||
       ((fVar23 + p->InvAreaF + 0.001 < (float)uVar25 && (iVar15 + p->InvDelayI <= iVar9)))) {
      if (p->Iter < 1) {
        __assert_fail("p->Iter > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x537,"void Nf_ManCutMatch(Nf_Man_t *, int)");
      }
      NVar3 = pNVar5[iObj].M[0][1].Cfg;
      iVar8 = pNVar5[iObj].M[0][1].D;
      fVar23 = pNVar5[iObj].M[0][1].F;
      *(undefined4 *)&pNVar5[iObj].M[1][1].field_0x0 =
           *(undefined4 *)&pNVar5[iObj].M[0][1].field_0x0;
      pNVar5[iObj].M[1][1].Cfg = NVar3;
      pNVar5[iObj].M[1][1].D = iVar8;
      pNVar5[iObj].M[1][1].F = fVar23;
      piVar13 = &pNVar12->M[1][1].D;
      *piVar13 = *piVar13 + p->InvDelayI;
      pNVar12->M[1][1].F = p->InvAreaF + pNVar12->M[1][1].F;
      puVar1 = &pNVar12->M[1][1].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      if (iVar10 == 0x3fffffff) {
        NVar3 = pNVar5[iObj].M[1][1].Cfg;
        iVar8 = pNVar5[iObj].M[1][1].D;
        fVar23 = pNVar5[iObj].M[1][1].F;
        *(undefined4 *)&((Nf_Mat_t *)((long)paNVar18 + 0))->field_0x0 =
             *(undefined4 *)&pNVar5[iObj].M[1][1].field_0x0;
        ((Nf_Mat_t *)((long)paNVar18 + 0))->Cfg = NVar3;
        pNVar5[iObj].M[1][0].D = iVar8;
        pNVar5[iObj].M[1][0].F = fVar23;
      }
    }
  }
  else {
    if (p->InvDelayI + iVar20 < iVar10) {
      NVar3 = pNVar12->M[0][0].Cfg;
      iVar10 = pNVar12->M[0][0].D;
      fVar23 = pNVar12->M[0][0].F;
      *(undefined4 *)&((Nf_Mat_t *)((long)paNVar18 + 0))->field_0x0 =
           *(undefined4 *)&pNVar12->M[0][0].field_0x0;
      ((Nf_Mat_t *)((long)paNVar18 + 0))->Cfg = NVar3;
      pNVar5[iObj].M[1][0].D = iVar10;
      pNVar5[iObj].M[1][0].F = fVar23;
      iVar15 = pNVar12->M[1][1].D;
      iVar10 = pNVar12->M[1][0].D + p->InvDelayI;
      pNVar12->M[1][0].D = iVar10;
      pNVar12->M[1][0].F = p->InvAreaF + pNVar12->M[1][0].F;
      puVar1 = &pNVar12->M[1][0].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      if (iVar15 == 0x3fffffff) {
        NVar3 = ((Nf_Mat_t *)((long)paNVar18 + 0))->Cfg;
        iVar15 = pNVar5[iObj].M[1][0].D;
        fVar23 = pNVar5[iObj].M[1][0].F;
        *(undefined4 *)&pNVar5[iObj].M[1][1].field_0x0 =
             *(undefined4 *)&((Nf_Mat_t *)((long)paNVar18 + 0))->field_0x0;
        pNVar5[iObj].M[1][1].Cfg = NVar3;
        pNVar5[iObj].M[1][1].D = iVar15;
        pNVar5[iObj].M[1][1].F = fVar23;
      }
    }
LAB_00605c18:
    iVar15 = pNVar12->M[0][1].D;
    if (iVar15 != 0x3fffffff) {
      uVar25 = CONCAT44(pNVar12->M[0][1].F,pNVar12->M[1][1].F);
      goto LAB_00605c34;
    }
LAB_00605cc8:
    if (p->Iter < 1) {
      __assert_fail("p->Iter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x52b,"void Nf_ManCutMatch(Nf_Man_t *, int)");
    }
    NVar3 = pNVar5[iObj].M[1][1].Cfg;
    iVar8 = pNVar5[iObj].M[1][1].D;
    fVar23 = pNVar5[iObj].M[1][1].F;
    *(undefined4 *)&pNVar5[iObj].M[0][1].field_0x0 = *(undefined4 *)&pNVar5[iObj].M[1][1].field_0x0;
    pNVar5[iObj].M[0][1].Cfg = NVar3;
    pNVar5[iObj].M[0][1].D = iVar8;
    pNVar5[iObj].M[0][1].F = fVar23;
    piVar13 = &pNVar12->M[0][1].D;
    *piVar13 = *piVar13 + p->InvDelayI;
    pNVar12->M[0][1].F = p->InvAreaF + pNVar12->M[0][1].F;
    puVar1 = &pNVar12->M[0][1].field_0x3;
    *puVar1 = *puVar1 | 0x40;
    if (iVar20 != 0x3fffffff) goto LAB_00605d55;
    NVar3 = pNVar5[iObj].M[0][1].Cfg;
    iVar8 = pNVar5[iObj].M[0][1].D;
    fVar23 = pNVar5[iObj].M[0][1].F;
    *(undefined4 *)&pNVar12->M[0][0].field_0x0 = *(undefined4 *)&pNVar5[iObj].M[0][1].field_0x0;
    pNVar12->M[0][0].Cfg = NVar3;
    pNVar12->M[0][0].D = iVar8;
    pNVar12->M[0][0].F = fVar23;
    iVar20 = pNVar12->M[0][0].D;
  }
  if (iVar20 == 0x3fffffff) {
    printf("Object %d has pDp unassigned.\n",(ulong)(uint)iObj);
  }
LAB_00605d55:
  if (pNVar12->M[1][0].D == 0x3fffffff) {
    printf("Object %d has pDn unassigned.\n",(ulong)(uint)iObj);
  }
  if (pNVar12->M[0][1].D == 0x3fffffff) {
    printf("Object %d has pAp unassigned.\n",(ulong)(uint)iObj);
  }
  if (pNVar12->M[1][1].D == 0x3fffffff) {
    printf("Object %d has pAn unassigned.\n",(ulong)(uint)iObj);
  }
  if (0x3ffffffe < pNVar12->M[0][0].D) {
    __assert_fail("pDp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x54f,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar12->M[1][0].D) {
    __assert_fail("pDn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x550,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar12->M[0][1].D) {
    __assert_fail("pAp->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x551,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  if (0x3ffffffe < pNVar12->M[1][1].D) {
    __assert_fail("pAn->D < SCL_INFINITY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x552,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar2 = &pNVar12->M[0][0].F;
  if (3.4028235e+38 < *pfVar2 || *pfVar2 == 3.4028235e+38) {
    __assert_fail("pDp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x554,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar2 = &pNVar12->M[1][0].F;
  if (3.4028235e+38 < *pfVar2 || *pfVar2 == 3.4028235e+38) {
    __assert_fail("pDn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x555,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar2 = &pNVar12->M[0][1].F;
  if (3.4028235e+38 < *pfVar2 || *pfVar2 == 3.4028235e+38) {
    __assert_fail("pAp->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x556,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  pfVar2 = &pNVar12->M[1][1].F;
  if (3.4028235e+38 < *pfVar2 || *pfVar2 == 3.4028235e+38) {
    __assert_fail("pAn->F < FLT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x557,"void Nf_ManCutMatch(Nf_Man_t *, int)");
  }
  return;
}

Assistant:

void Nf_ManCutMatch( Nf_Man_t * p, int iObj )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    Nf_Mat_t * pDp = &pBest->M[0][0];
    Nf_Mat_t * pDn = &pBest->M[1][0];
    Nf_Mat_t * pAp = &pBest->M[0][1];
    Nf_Mat_t * pAn = &pBest->M[1][1];
    float FlowRefPf  = Nf_ObjFlowRefs(p, iObj, 0);
    float FlowRefNf  = Nf_ObjFlowRefs(p, iObj, 1);
    int i, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    int Required[2] = {0};
    if ( p->Iter )
    {
        Nf_ObjComputeRequired( p, iObj );
        Required[0] = Nf_ObjRequired( p, iObj, 0 );
        Required[1] = Nf_ObjRequired( p, iObj, 1 );
    }
    memset( pBest, 0, sizeof(Nf_Obj_t) );
    pDp->D = SCL_INFINITY; pDp->F = FLT_MAX;
    pDn->D = SCL_INFINITY; pDn->F = FLT_MAX;
    pAp->D = SCL_INFINITY; pAp->F = FLT_MAX;
    pAn->D = SCL_INFINITY; pAn->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, i )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        assert( !Nf_CutIsTriv(pCut, iObj) );
        assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
        assert( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) );
        Nf_ManCutMatchOne( p, iObj, pCut, pCutSet );
    }

/*
    if ( 461 == iObj && p->Iter == 0 )
    {
        printf( "\nObj %6d (%.2f %.2f):\n", iObj, Scl_Int2Flt(Required[0]), Scl_Int2Flt(Required[1]) );
        Nf_ManCutMatchPrint( p, iObj, "Dp", &pBest->M[0][0] );
        Nf_ManCutMatchPrint( p, iObj, "Dn", &pBest->M[1][0] );
        Nf_ManCutMatchPrint( p, iObj, "Ap", &pBest->M[0][1] );
        Nf_ManCutMatchPrint( p, iObj, "An", &pBest->M[1][1] );
        printf( "\n" );
    }
*/
    // divide by ref count
    pDp->F = pDp->F / FlowRefPf;
    pAp->F = pAp->F / FlowRefPf;
    pDn->F = pDn->F / FlowRefNf;
    pAn->F = pAn->F / FlowRefNf;

    // add the inverters
    assert( pDp->D < SCL_INFINITY || pDn->D < SCL_INFINITY );
    if ( pDp->D > pDn->D + p->InvDelayI )
    {
        *pDp = *pDn;
        pDp->D += p->InvDelayI;
        pDp->F += p->InvAreaF;
        pDp->fCompl = 1;
        if ( pAp->D == SCL_INFINITY )
            *pAp = *pDp;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 1 );
    }
    else if ( pDn->D > pDp->D + p->InvDelayI )
    {
        *pDn = *pDp;
        pDn->D += p->InvDelayI;
        pDn->F += p->InvAreaF;
        pDn->fCompl = 1;
        if ( pAn->D == SCL_INFINITY )
            *pAn = *pDn;
        //printf( "Using inverter to improve delay at node %d in phase %d.\n", iObj, 0 );
    }
    //assert( pAp->F < FLT_MAX || pAn->F < FLT_MAX );
    // try replacing pos with neg
    if ( pAp->D == SCL_INFINITY || (pAp->F > pAn->F + p->InvAreaF + NF_EPSILON && pAn->D + p->InvDelayI <= Required[0]) )
    {
        assert( p->Iter > 0 );
        *pAp = *pAn;
        pAp->D += p->InvDelayI;
        pAp->F += p->InvAreaF;
        pAp->fCompl = 1;
        if ( pDp->D == SCL_INFINITY )
            *pDp = *pAp;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 1 );
    }
    // try replacing neg with pos
    else if ( pAn->D == SCL_INFINITY || (pAn->F > pAp->F + p->InvAreaF + NF_EPSILON && pAp->D + p->InvDelayI <= Required[1]) )
    {
        assert( p->Iter > 0 );
        *pAn = *pAp;
        pAn->D += p->InvDelayI;
        pAn->F += p->InvAreaF;
        pAn->fCompl = 1;
        if ( pDn->D == SCL_INFINITY )
            *pDn = *pAn;
        //printf( "Using inverter to improve area at node %d in phase %d.\n", iObj, 0 );
    }

    if ( pDp->D == SCL_INFINITY )
        printf( "Object %d has pDp unassigned.\n", iObj );
    if ( pDn->D == SCL_INFINITY )
        printf( "Object %d has pDn unassigned.\n", iObj );
    if ( pAp->D == SCL_INFINITY )
        printf( "Object %d has pAp unassigned.\n", iObj );
    if ( pAn->D == SCL_INFINITY )
        printf( "Object %d has pAn unassigned.\n", iObj );
/*
    pDp->F = Abc_MinFloat( pDp->F, FLT_MAX/SCL_NUM );
    pDn->F = Abc_MinFloat( pDn->F, FLT_MAX/SCL_NUM );
    pAp->F = Abc_MinFloat( pAp->F, FLT_MAX/SCL_NUM );  
    pAn->F = Abc_MinFloat( pAn->F, FLT_MAX/SCL_NUM );
*/    
    assert( pDp->D < SCL_INFINITY );
    assert( pDn->D < SCL_INFINITY );
    assert( pAp->D < SCL_INFINITY );
    assert( pAn->D < SCL_INFINITY );

    assert( pDp->F < FLT_MAX );
    assert( pDn->F < FLT_MAX );
    assert( pAp->F < FLT_MAX );
    assert( pAn->F < FLT_MAX );

/*
    if ( p->Iter && (pDp->D > Required[0] || pDn->D > Required[1]) )
    {
        printf( "%5d : ", iObj );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Rp = %6.2f  ", Scl_Int2Flt(Required[0]) );
        printf( "Rn = %6.2f  ", Scl_Int2Flt(Required[1]) );
        printf( "\n" );
    }
*/
}